

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O1

_Bool COSE_Recipient_SetKey_secret
                (HCOSE_RECIPIENT hRecipient,byte *rgbKey,int cbKey,byte *rgbKid,int cbKid,
                cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor *pcVar3;
  uint8_t *data;
  uint8_t *data_00;
  COSE_RecipientInfo *p;
  cn_cbor *value;
  cn_cbor_errback cbor_error;
  cn_cbor_errback local_40;
  int local_34;
  
  if ((hRecipient == (HCOSE_RECIPIENT)0x0) ||
     (_Var1 = _COSE_IsInList(RecipientRoot,(COSE *)hRecipient), !_Var1)) {
    cVar2 = COSE_ERR_INVALID_HANDLE;
LAB_001fc776:
    pcVar3 = (cn_cbor *)0x0;
    value = (cn_cbor *)0x0;
LAB_001fc78a:
    data_00 = (uint8_t *)0x0;
    data = (uint8_t *)0x0;
    if (perr == (cose_errback *)0x0) goto LAB_001fc792;
  }
  else {
    if (rgbKey == (byte *)0x0) {
      cVar2 = COSE_ERR_INVALID_PARAMETER;
      goto LAB_001fc776;
    }
    pcVar3 = _COSE_map_get_int((COSE *)hRecipient,1,7,perr);
    if (pcVar3 != (cn_cbor *)0x0) {
      if ((pcVar3->type == CN_CBOR_INT) && ((pcVar3->v).bytes == (uint8_t *)0xfffffffffffffffa)) {
LAB_001fc81c:
        if (cbKid < 1) {
          value = (cn_cbor *)0x0;
        }
        else {
          local_34 = cbKey;
          data = (uint8_t *)calloc((ulong)(uint)cbKid,1);
          if (data == (uint8_t *)0x0) {
            cVar2 = COSE_ERR_OUT_OF_MEMORY;
            goto LAB_001fc757;
          }
          memcpy(data,rgbKid,(ulong)(uint)cbKid);
          value = cn_cbor_data_create(data,cbKid,&local_40);
          if (value == (cn_cbor *)0x0) {
            pcVar3 = (cn_cbor *)0x0;
            value = (cn_cbor *)0x0;
            goto LAB_001fc9ad;
          }
          _Var1 = COSE_Recipient_map_put_int(hRecipient,4,value,2,perr);
          cbKey = local_34;
          if (!_Var1) {
            pcVar3 = (cn_cbor *)0x0;
            goto LAB_001fc9b8;
          }
        }
        data_00 = (uint8_t *)calloc((long)cbKey,1);
        if (data_00 != (uint8_t *)0x0) {
          memcpy(data_00,rgbKey,(long)cbKey);
          pcVar3 = cn_cbor_map_create(&local_40);
          if (pcVar3 == (cn_cbor *)0x0) {
            pcVar3 = (cn_cbor *)0x0;
          }
          else {
            value = cn_cbor_int_create(4,&local_40);
            if (value != (cn_cbor *)0x0) {
              _Var1 = cn_cbor_mapput_int(pcVar3,1,value,&local_40);
              if (!_Var1) {
                data = (uint8_t *)0x0;
                goto LAB_001fc9d3;
              }
              value = cn_cbor_data_create(data_00,cbKey,&local_40);
              if (value != (cn_cbor *)0x0) {
                _Var1 = cn_cbor_mapput_int(pcVar3,-1,value,&local_40);
                if (!_Var1) {
                  data = (uint8_t *)0x0;
                  goto LAB_001fc9ad;
                }
                if ((hRecipient != (HCOSE_RECIPIENT)0x0) &&
                   (_Var1 = _COSE_IsInList(RecipientRoot,(COSE *)hRecipient), _Var1)) {
                  *(cn_cbor **)(hRecipient + 0x78) = pcVar3;
                  return true;
                }
                cVar2 = COSE_ERR_INVALID_HANDLE;
                value = (cn_cbor *)0x0;
                goto LAB_001fc78a;
              }
            }
            value = (cn_cbor *)0x0;
          }
          data = (uint8_t *)0x0;
          goto LAB_001fc9d3;
        }
        cVar2 = COSE_ERR_OUT_OF_MEMORY;
        pcVar3 = (cn_cbor *)0x0;
      }
      else {
        cVar2 = COSE_ERR_INVALID_PARAMETER;
LAB_001fc757:
        pcVar3 = (cn_cbor *)0x0;
        value = (cn_cbor *)0x0;
      }
      goto LAB_001fc78a;
    }
    pcVar3 = cn_cbor_int_create(-6,&local_40);
    if (pcVar3 != (cn_cbor *)0x0) {
      _Var1 = COSE_Recipient_map_put_int(hRecipient,1,pcVar3,2,perr);
      if (_Var1) goto LAB_001fc81c;
      value = (cn_cbor *)0x0;
LAB_001fc9b8:
      data = (uint8_t *)0x0;
      data_00 = (uint8_t *)0x0;
      goto LAB_001fc792;
    }
    pcVar3 = (cn_cbor *)0x0;
    value = (cn_cbor *)0x0;
    data = (uint8_t *)0x0;
LAB_001fc9ad:
    data_00 = (uint8_t *)0x0;
LAB_001fc9d3:
    if (perr == (cose_errback *)0x0) goto LAB_001fc792;
    cVar2 = _MapFromCBOR(local_40);
  }
  perr->err = cVar2;
LAB_001fc792:
  if (pcVar3 != (cn_cbor *)0x0) {
    cn_cbor_free(pcVar3);
  }
  if (value != (cn_cbor *)0x0) {
    cn_cbor_free(value);
  }
  if (data != (uint8_t *)0x0) {
    free(data);
  }
  if (data_00 != (uint8_t *)0x0) {
    free(data_00);
  }
  return false;
}

Assistant:

bool COSE_Recipient_SetKey_secret(HCOSE_RECIPIENT hRecipient, const byte * rgbKey, int cbKey, const byte * rgbKid, int cbKid, cose_errback * perr)
{
	COSE_RecipientInfo * p;
	cn_cbor * cn_Temp = NULL;
	cn_cbor * cnTemp = NULL;
	cn_cbor_errback cbor_error;
	byte * pbTemp = NULL;
	byte * pbKey = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
#endif

	CHECK_CONDITION(IsValidRecipientHandle(hRecipient), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(rgbKey != NULL, COSE_ERR_INVALID_PARAMETER);

	p = (COSE_RecipientInfo *)hRecipient;

#ifdef USE_CBOR_CONTEXT
	context = &p->m_encrypt.m_message.m_allocContext;
#endif

	cn_cbor * cnAlg = _COSE_map_get_int(&p->m_encrypt.m_message, COSE_Header_Algorithm, COSE_BOTH, perr);
	if (cnAlg != NULL) {
		CHECK_CONDITION(cnAlg->type == CN_CBOR_INT && cnAlg->v.sint == COSE_Algorithm_Direct, COSE_ERR_INVALID_PARAMETER);
	}
	else {
		cn_Temp = cn_cbor_int_create(COSE_Algorithm_Direct, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cn_Temp != NULL, cbor_error);
		if (!COSE_Recipient_map_put_int(hRecipient, COSE_Header_Algorithm, cn_Temp, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
		cn_Temp = NULL;
	}

	if (cbKid > 0) {
		pbTemp = (byte *)COSE_CALLOC(cbKid, 1, context);
		CHECK_CONDITION(pbTemp != NULL, COSE_ERR_OUT_OF_MEMORY);

		memcpy(pbTemp, rgbKid, cbKid);
		cnTemp = cn_cbor_data_create(pbTemp, cbKid, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cnTemp != NULL, cbor_error);
		pbTemp = NULL;

		if (!COSE_Recipient_map_put_int(hRecipient, COSE_Header_KID, cnTemp, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
	}

	pbKey = (byte *)COSE_CALLOC(cbKey, 1, context);
	CHECK_CONDITION(pbKey != NULL, COSE_ERR_OUT_OF_MEMORY);

	memcpy(pbKey, rgbKey, cbKey);

	cn_Temp = cn_cbor_map_create(CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cn_Temp != NULL, cbor_error);

	cnTemp = cn_cbor_int_create(4, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cnTemp != NULL, cbor_error);
	CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn_Temp, COSE_Key_Type, cnTemp, CBOR_CONTEXT_PARAM_COMMA &cbor_error), cbor_error);
	cnTemp = NULL;

	cnTemp = cn_cbor_data_create(pbKey, cbKey, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cnTemp != NULL, cbor_error);
	pbKey = NULL;
	CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn_Temp, -1, cnTemp, CBOR_CONTEXT_PARAM_COMMA &cbor_error), cbor_error);
	cnTemp = NULL;

	if (!COSE_Recipient_SetKey(hRecipient, cn_Temp, perr)) goto errorReturn;
	cn_Temp = NULL;

	return true;

errorReturn:
	if (cn_Temp != NULL) CN_CBOR_FREE(cn_Temp, context);
	if (cnTemp != NULL) CN_CBOR_FREE(cnTemp, context);
	if (pbTemp != NULL) COSE_FREE(pbTemp, context);
	if (pbKey != NULL) COSE_FREE(pbKey, context);
	return false;
}